

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  size_type sVar3;
  byte *pbVar4;
  pointer pcVar5;
  App *pAVar6;
  IncorrectConstruction *pIVar7;
  long *plVar8;
  size_type *psVar9;
  size_type sVar10;
  App_p subcom;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  App_p local_c0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  sVar3 = subcommand_name->_M_string_length;
  if (sVar3 != 0) {
    pbVar4 = (byte *)(subcommand_name->_M_dataplus)._M_p;
    bVar2 = *pbVar4;
    if (0x21 < bVar2 && bVar2 != 0x2d) {
      sVar10 = 1;
      do {
        if (sVar3 == sVar10) goto LAB_0010a5fb;
        bVar2 = pbVar4[sVar10];
        if (((bVar2 == 0x3a) || (bVar2 == 0x3d)) || (bVar2 == 0x7b)) break;
        sVar10 = sVar10 + 1;
      } while (bVar2 == 9 || 0x20 < bVar2);
    }
    pbVar4 = (byte *)(subcommand_name->_M_dataplus)._M_p;
    bVar2 = *pbVar4;
    if ((bVar2 == 0x2d) || (bVar2 < 0x22)) {
      pIVar7 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Subcommand name starts with invalid character, \'!\' and \'-\' and control characters"
                 ,"");
      IncorrectConstruction::IncorrectConstruction(pIVar7,&local_50);
      __cxa_throw(pIVar7,&IncorrectConstruction::typeinfo,Error::~Error);
    }
    sVar10 = 0;
    do {
      bVar2 = pbVar4[sVar10];
      if (((bVar2 == 0x3a) || (bVar2 == 0x3d)) || ((bVar2 == 0x7b || (bVar2 != 9 && bVar2 < 0x21))))
      {
        pIVar7 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Subcommand name contains invalid character (\'","");
        ::std::operator+(&local_100,&local_70,bVar2);
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_100);
        local_90._M_dataplus._M_p = (pointer)*plVar8;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
          local_90.field_2._M_allocated_capacity = *psVar9;
          local_90.field_2._8_8_ = plVar8[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar9;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        IncorrectConstruction::IncorrectConstruction(pIVar7,&local_90);
        __cxa_throw(pIVar7,&IncorrectConstruction::typeinfo,Error::~Error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar3 != sVar10);
  }
LAB_0010a5fb:
  local_100._M_dataplus._M_p = (pointer)operator_new(0x360);
  local_e0._M_dataplus._M_p = (subcommand_description->_M_dataplus)._M_p;
  paVar1 = &subcommand_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == paVar1) {
    local_e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e0.field_2._8_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 8);
    local_e0.field_2._12_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 0xc);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_e0._M_string_length = subcommand_description->_M_string_length;
  (subcommand_description->_M_dataplus)._M_p = (pointer)paVar1;
  subcommand_description->_M_string_length = 0;
  (subcommand_description->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (subcommand_name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar5,pcVar5 + subcommand_name->_M_string_length);
  App((App *)local_100._M_dataplus._M_p,&local_e0,&local_b0,this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::App*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100._M_string_length,
             (App *)local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_c0.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_100._M_dataplus._M_p;
  local_c0.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_string_length;
  local_100._M_dataplus._M_p = (pointer)0x0;
  local_100._M_string_length = 0;
  pAVar6 = add_subcommand(this,&local_c0);
  if (local_c0.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._M_string_length);
  }
  return pAVar6;
}

Assistant:

CLI11_INLINE App *App::add_subcommand(std::string subcommand_name, std::string subcommand_description) {
    if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
        if(!detail::valid_first_char(subcommand_name[0])) {
            throw IncorrectConstruction(
                "Subcommand name starts with invalid character, '!' and '-' and control characters");
        }
        for(auto c : subcommand_name) {
            if(!detail::valid_later_char(c)) {
                throw IncorrectConstruction(std::string("Subcommand name contains invalid character ('") + c +
                                            "'), all characters are allowed except"
                                            "'=',':','{','}', ' ', and control characters");
            }
        }
    }
    CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
    return add_subcommand(std::move(subcom));
}